

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

Entry * __thiscall
kj::
ArrayBuilder<kj::HashMap<kj::Array<unsigned_char>,capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Entry>
::
add<kj::HashMap<kj::Array<unsigned_char>,capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Entry>
          (ArrayBuilder<kj::HashMap<kj::Array<unsigned_char>,capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Entry>
           *this,Entry *params)

{
  undefined8 *puVar1;
  Entry *pEVar2;
  
  puVar1 = *(undefined8 **)(this + 8);
  *puVar1 = (params->key).content.ptr;
  puVar1[1] = (params->key).content.size_;
  puVar1[2] = (params->value).disposer;
  (params->key).content.ptr = (char *)0x0;
  (params->key).content.size_ = 0;
  Maybe<kj::Promise<void>_>::Maybe
            ((Maybe<kj::Promise<void>_> *)(puVar1 + 3),
             (Maybe<kj::Promise<void>_> *)&(params->value).ptr);
  puVar1[5] = params[1].key.content.size_;
  puVar1[6] = params[1].value.disposer;
  params[1].value.disposer = (Disposer *)0x0;
  pEVar2 = *(Entry **)(this + 8);
  *(Vat ***)(this + 8) = &pEVar2[1].value.ptr;
  return pEVar2;
}

Assistant:

T& add(Params&&... params) KJ_LIFETIMEBOUND {
    KJ_IREQUIRE(pos < endPtr, "Added too many elements to ArrayBuilder.");
    ctor(*pos, kj::fwd<Params>(params)...);
    return *pos++;
  }